

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::Tdiv<int>(VM *this)

{
  int_t iVar1;
  int_t iVar2;
  DivideByZero *this_00;
  int_t lhs;
  int_t rhs;
  VM *this_local;
  
  iVar1 = POP<int>(this);
  iVar2 = POP<int>(this);
  if (iVar1 == 0) {
    this_00 = (DivideByZero *)__cxa_allocate_exception(8);
    DivideByZero::DivideByZero(this_00);
    __cxa_throw(this_00,&DivideByZero::typeinfo,DivideByZero::~DivideByZero);
  }
  PUSH<int>(this,iVar2 / iVar1);
  return;
}

Assistant:

void VM::Tdiv() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    if constexpr (std::is_integral_v<T>) {
        if (rhs == 0) {
            throw DivideByZero();
        }
    }
    PUSH(lhs/rhs);
}